

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNBu12.cpp
# Opt level: O0

void __thiscall NaPNBus1i2o::relate_connectors(NaPNBus1i2o *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  NaVector *pNVar4;
  NaVector *pNVar5;
  NaPetriCnInput *this_00;
  long in_RDI;
  double fRatio2;
  int nOut2;
  int nOut1;
  NaPetriCnInput *in_stack_ffffffffffffffb8;
  uint local_10;
  uint local_c;
  
  if (*(int *)(in_RDI + 400) == 0) {
    pNVar4 = NaPetriCnInput::data(in_stack_ffffffffffffffb8);
    iVar1 = (*pNVar4->_vptr_NaVector[6])();
    local_c = iVar1 - *(int *)(in_RDI + 0x194);
    if ((int)local_c < 0) {
      local_c = 0;
    }
    pNVar4 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x90));
    (*pNVar4->_vptr_NaVector[4])(pNVar4,(ulong)local_c);
    pNVar4 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x110));
    pNVar5 = NaPetriCnInput::data(in_stack_ffffffffffffffb8);
    iVar1 = (*pNVar5->_vptr_NaVector[6])();
    (*pNVar4->_vptr_NaVector[4])(pNVar4,(ulong)(iVar1 - local_c));
  }
  else if (*(int *)(in_RDI + 0x194) == 0) {
    pNVar4 = NaPetriCnInput::data(in_stack_ffffffffffffffb8);
    iVar1 = (*pNVar4->_vptr_NaVector[6])();
    local_10 = iVar1 - *(int *)(in_RDI + 400);
    if ((int)local_10 < 0) {
      local_10 = 0;
    }
    pNVar4 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x110));
    (*pNVar4->_vptr_NaVector[4])(pNVar4,(ulong)local_10);
    pNVar4 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x90));
    pNVar5 = NaPetriCnInput::data(in_stack_ffffffffffffffb8);
    iVar1 = (*pNVar5->_vptr_NaVector[6])();
    (*pNVar4->_vptr_NaVector[4])(pNVar4,(ulong)(iVar1 - local_10));
  }
  else {
    iVar1 = *(int *)(in_RDI + 400);
    iVar3 = *(int *)(in_RDI + 0x194);
    this_00 = (NaPetriCnInput *)NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x110));
    pNVar4 = NaPetriCnInput::data(this_00);
    uVar2 = (*pNVar4->_vptr_NaVector[6])();
    (*(this_00->super_NaPetriConnector)._vptr_NaPetriConnector[4])
              (this_00,(long)(((double)iVar3 / (double)(iVar1 + iVar3)) * (double)uVar2) &
                       0xffffffff);
    pNVar4 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x90));
    pNVar5 = NaPetriCnInput::data(this_00);
    iVar1 = (*pNVar5->_vptr_NaVector[6])();
    pNVar5 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x110));
    iVar3 = (*pNVar5->_vptr_NaVector[6])();
    (*pNVar4->_vptr_NaVector[4])(pNVar4,(ulong)(uint)(iVar1 - iVar3));
  }
  return;
}

Assistant:

void
NaPNBus1i2o::relate_connectors ()
{
    if(0 == nOutDimProp1) {
	int nOut1 = in.data().dim() - nOutDimProp2;
	if(nOut1 < 0)
	    nOut1 = 0;
	out1.data().new_dim(nOut1);
	out2.data().new_dim(in.data().dim() - nOut1);
    }
    else if(0 == nOutDimProp2) {
	int nOut2 = in.data().dim() - nOutDimProp1;
	if(nOut2 < 0)
	    nOut2 = 0;
	out2.data().new_dim(nOut2);
	out1.data().new_dim(in.data().dim() - nOut2);
    }
    else {
	double fRatio2 = (double)nOutDimProp2 / (nOutDimProp1 + nOutDimProp2);

	out2.data().new_dim(fRatio2 * in.data().dim());
	out1.data().new_dim(in.data().dim() - out2.data().dim());
    }
}